

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O2

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
parseDirectiveLoadElf(Parser *parser,int flags)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *source;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *source_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *source_01;
  undefined4 in_register_00000034;
  undefined1 local_b0 [8];
  vector<Expression,_std::allocator<Expression>_> list;
  path local_88;
  path local_68;
  StringLiteral inputName;
  StringLiteral outputName;
  
  list.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  list.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  list.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bVar1 = Parser::parseExpressionList((Parser *)CONCAT44(in_register_00000034,flags),&list,1,2);
  if (!bVar1) {
    (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    goto LAB_001588d1;
  }
  inputName._value._M_dataplus._M_p = (pointer)&inputName._value.field_2;
  inputName._value._M_string_length = 0;
  outputName._value._M_dataplus._M_p = (pointer)&outputName._value.field_2;
  outputName._value._M_string_length = 0;
  inputName._value.field_2._M_local_buf[0] = '\0';
  outputName._value.field_2._M_local_buf[0] = '\0';
  bVar1 = Expression::evaluateString
                    (list.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
                     super__Vector_impl_data._M_start,&inputName,true);
  if (bVar1) {
    if ((long)list.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)list.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
              super__Vector_impl_data._M_start == 0x30) {
      bVar1 = Expression::evaluateString
                        (list.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
                         super__Vector_impl_data._M_start + 1,&outputName,true);
      if (!bVar1) goto LAB_0015887e;
      ghc::filesystem::u8path<std::__cxx11::string,ghc::filesystem::path>
                (&local_88,(filesystem *)&inputName,source_00);
      ghc::filesystem::u8path<std::__cxx11::string,ghc::filesystem::path>
                (&local_68,(filesystem *)&outputName,source_01);
      std::make_unique<DirectiveLoadMipsElf,ghc::filesystem::path,ghc::filesystem::path>
                ((path *)local_b0,&local_88);
      (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)local_b0;
      local_b0 = (undefined1  [8])0x0;
      ghc::filesystem::path::~path(&local_68);
    }
    else {
      ghc::filesystem::u8path<std::__cxx11::string,ghc::filesystem::path>
                (&local_88,(filesystem *)&inputName,source);
      std::make_unique<DirectiveLoadMipsElf,ghc::filesystem::path>(&local_68);
      (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)local_68._path._M_dataplus._M_p;
      local_68._path._M_dataplus._M_p = (pointer)0x0;
    }
    ghc::filesystem::path::~path(&local_88);
  }
  else {
LAB_0015887e:
    (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  }
  std::__cxx11::string::~string((string *)&outputName);
  std::__cxx11::string::~string((string *)&inputName);
LAB_001588d1:
  std::vector<Expression,_std::allocator<Expression>_>::~vector(&list);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> parseDirectiveLoadElf(Parser& parser, int flags)
{
	std::vector<Expression> list;
	if (!parser.parseExpressionList(list,1,2))
		return nullptr;

	StringLiteral inputName, outputName;
	if (!list[0].evaluateString(inputName,true))
		return nullptr;

	if (list.size() == 2)
	{
		if (!list[1].evaluateString(outputName,true))
			return nullptr;
		return std::make_unique<DirectiveLoadMipsElf>(inputName.path(),outputName.path());
	} else {
		return std::make_unique<DirectiveLoadMipsElf>(inputName.path());
	}
}